

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcache.hpp
# Opt level: O0

void __thiscall
CorUnix::CSHRSynchCache<CorUnix::CSynchData>::Add
          (CSHRSynchCache<CorUnix::CSynchData> *this,CPalThread *pthrCurrent,SHMPTR shridObj)

{
  int iVar1;
  _USHRSynchCacheStackNode *val;
  _USHRSynchCacheStackNode *p_Var2;
  CSynchData *pObj;
  USHRSynchCacheStackNode *pNode;
  SHMPTR shridObj_local;
  CPalThread *pthrCurrent_local;
  CSHRSynchCache<CorUnix::CSynchData> *this_local;
  
  if (shridObj != 0) {
    val = (_USHRSynchCacheStackNode *)SHMPtrToPtr(shridObj);
    (val->pointers).shrid = shridObj;
    Lock(this,pthrCurrent);
    iVar1 = ::Volatile::operator_cast_to_int((Volatile *)&this->m_iDepth);
    if (iVar1 < this->m_iMaxDepth) {
      Volatile<int>::operator++(&this->m_iDepth,0);
      iVar1 = ::Volatile::operator_cast_to_int((Volatile *)&this->m_iDepth);
      if (this->m_iMaxTrackedDepth < iVar1) {
        iVar1 = ::Volatile::operator_cast_to_int((Volatile *)&this->m_iDepth);
        this->m_iMaxTrackedDepth = iVar1;
      }
      p_Var2 = ::Volatile::operator_cast_to__USHRSynchCacheStackNode_((Volatile *)this);
      (val->pointers).pNext = p_Var2;
      Volatile<CorUnix::CSHRSynchCache<CorUnix::CSynchData>::_USHRSynchCacheStackNode_*>::operator=
                (&this->m_pHead,val);
    }
    else {
      SHMfree(shridObj);
    }
    Unlock(this,pthrCurrent);
  }
  return;
}

Assistant:

void Add(CPalThread * pthrCurrent, SharedID shridObj)
        {
            if (NULLSharedID == shridObj)
            {
                return;
            }

            USHRSynchCacheStackNode * pNode = SharedIDToTypePointer(USHRSynchCacheStackNode, shridObj);
            T * pObj = reinterpret_cast<T *>(pNode);

            pObj->~T();
            
            pNode->pointers.shrid = shridObj;
            
            Lock(pthrCurrent);
            if (m_iDepth < m_iMaxDepth)
            {
                m_iDepth++;
#ifdef _DEBUG
                if (m_iDepth > m_iMaxTrackedDepth)
                {
                    m_iMaxTrackedDepth = m_iDepth;
                }
#endif
                pNode->pointers.pNext = m_pHead;
                m_pHead = pNode;
            }
            else
            {
                RawSharedObjectFree(shridObj);
            }
            Unlock(pthrCurrent);       
        }